

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixOpen(unqlite_vfs *pVfs,char *zPath,unqlite_file *pFile,uint flags)

{
  int __fd;
  uint uVar1;
  uint local_7c;
  char *pcStack_78;
  mode_t openMode;
  char *zName;
  int isOpenDirectory;
  int isReadWrite;
  int isReadonly;
  int isCreate;
  int isDelete;
  int isExclusive;
  UnixUnusedFd *pUnused;
  undefined4 local_48;
  int rc;
  int noLock;
  int openFlags;
  int dirfd;
  int fd;
  unixFile *p;
  unqlite_file *puStack_28;
  uint flags_local;
  unqlite_file *pFile_local;
  char *zPath_local;
  unqlite_vfs *pVfs_local;
  
  openFlags = -1;
  noLock = -1;
  rc = 0;
  pUnused._4_4_ = 0;
  isCreate = flags & 8;
  isReadonly = flags & 0x10;
  zName._0_4_ = flags & 4;
  isOpenDirectory = flags & 1;
  zName._4_4_ = flags & 2;
  pcStack_78 = zPath;
  isReadWrite = (uint)zName;
  _dirfd = pFile;
  p._4_4_ = flags;
  puStack_28 = pFile;
  pFile_local = (unqlite_file *)zPath;
  zPath_local = (char *)pVfs;
  SyZero(pFile,0x48);
  _isDelete = (unqlite_io_methods *)findReusableFd(pcStack_78,p._4_4_);
  if (_isDelete == (unqlite_io_methods *)0x0) {
    _isDelete = (unqlite_io_methods *)unqlite_malloc(0x10);
    if (_isDelete == (unqlite_io_methods *)0x0) {
      return -1;
    }
  }
  else {
    openFlags = _isDelete->iVersion;
  }
  _dirfd[5].pMethods = _isDelete;
  if (zName._4_4_ != 0) {
    rc = rc | 2;
  }
  if (isReadWrite != 0) {
    rc = rc | 0x40;
  }
  if (isCreate != 0) {
    rc = rc | 0x20080;
  }
  if (openFlags < 0) {
    pUnused._4_4_ = findCreateFileMode(pcStack_78,p._4_4_,&local_7c);
    if (pUnused._4_4_ != 0) {
      return pUnused._4_4_;
    }
    openFlags = open(pcStack_78,rc,(ulong)local_7c);
    if (openFlags < 0) {
      pUnused._4_4_ = -2;
      goto LAB_00111a24;
    }
  }
  if (_dirfd[5].pMethods != (unqlite_io_methods *)0x0) {
    (_dirfd[5].pMethods)->iVersion = openFlags;
    *(uint *)&(_dirfd[5].pMethods)->field_0x4 = p._4_4_;
  }
  if (isReadonly != 0) {
    unlink(pcStack_78);
  }
  if ((uint)zName != 0) {
    pUnused._4_4_ = openDirectory((char *)pFile_local,&noLock);
    if (pUnused._4_4_ != 0) {
      close(openFlags);
      goto LAB_00111a24;
    }
    pUnused._4_4_ = 0;
  }
  __fd = openFlags;
  uVar1 = fcntl(openFlags,1,0);
  fcntl(__fd,2,(ulong)(uVar1 | 1));
  local_48 = 0;
  pUnused._4_4_ =
       fillInUnixFile((unqlite_vfs *)zPath_local,openFlags,noLock,puStack_28,(char *)pFile_local,0,
                      isReadonly);
LAB_00111a24:
  if (pUnused._4_4_ != 0) {
    unqlite_free(_dirfd[5].pMethods);
  }
  return pUnused._4_4_;
}

Assistant:

static int unixOpen(
  unqlite_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  unqlite_file *pFile,         /* The file descriptor to be filled in */
  unsigned int flags           /* Input flags to control the opening */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int dirfd = -1;                /* Directory file descriptor */
  int openFlags = 0;             /* Flags to pass to open() */
  int noLock;                    /* True to omit locking primitives */
  int rc = UNQLITE_OK;            /* Function Return Code */
  UnixUnusedFd *pUnused;
  int isExclusive  = (flags & UNQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & UNQLITE_OPEN_TEMP_DB);
  int isCreate     = (flags & UNQLITE_OPEN_CREATE);
  int isReadonly   = (flags & UNQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & UNQLITE_OPEN_READWRITE);
  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
#ifndef UNQLITE_DISABLE_DIRSYNC
  int isOpenDirectory = isCreate;
#endif
  const char *zName = zPath;

  SyZero(p,sizeof(unixFile));
  
  pUnused = findReusableFd(zName, flags);
  if( pUnused ){
	  fd = pUnused->fd;
  }else{
	  pUnused = unqlite_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return UNQLITE_NOMEM;
      }
  }
  p->pUnused = pUnused;
  
  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    rc = findCreateFileMode(zName, flags, &openMode);
    if( rc!=UNQLITE_OK ){
      return rc;
    }
    fd = open(zName, openFlags, openMode);
    if( fd<0 ){
	  rc = UNQLITE_IOERR;
      goto open_finished;
    }
  }
  
  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
    unlink(zName);
  }

#ifndef UNQLITE_DISABLE_DIRSYNC
  if( isOpenDirectory ){
    rc = openDirectory(zPath, &dirfd);
    if( rc!=UNQLITE_OK ){
      /* It is safe to close fd at this point, because it is guaranteed not
      ** to be open on a database file. If it were open on a database file,
      ** it would not be safe to close as this would release any locks held
      ** on the file by this process.  */
      close(fd);             /* silently leak if fail, already in error */
      goto open_finished;
    }
  }
#endif

#ifdef FD_CLOEXEC
  fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif

  noLock = 0;

#if defined(__APPLE__) 
  struct statfs fsInfo;
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    if( dirfd>=0 ) close(dirfd); /* silently leak if fail, in error */
    close(fd); /* silently leak if fail, in error */
    return UNQLITE_IOERR;
  }
  if (0 == SyStrncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= UNQLITE_FSFLAGS_IS_MSDOS;
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, dirfd, pFile, zPath, noLock, isDelete);
open_finished:
  if( rc!=UNQLITE_OK ){
    unqlite_free(p->pUnused);
  }
  return rc;
}